

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O1

Seq __thiscall xt::LSeq::next(LSeq *this)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  LSeq *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  Seq SVar3;
  
  lVar1 = *(long *)(in_RSI + 8);
  if (*(long *)(lVar1 + 0x28) == 0) {
    (this->super_ISeq)._vptr_ISeq = (_func_int **)0x0;
    (this->l).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
  }
  else {
    __p = (LSeq *)operator_new(0x18);
    peVar2 = *(element_type **)(lVar1 + 0x28);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x30);
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (__p->super_ISeq)._vptr_ISeq = (_func_int **)&PTR_first_0010ccf8;
      (__p->l).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (__p->l).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      (__p->super_ISeq)._vptr_ISeq = (_func_int **)&PTR_first_0010ccf8;
      (__p->l).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (__p->l).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
      ;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    (this->super_ISeq)._vptr_ISeq = (_func_int **)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::LSeq*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->l,__p);
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  SVar3.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  SVar3.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar3.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq LSeq::next() const { if (l->rest) return Seq(new LSeq(l->rest)); return Seq(); }